

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::handle_peer_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  __int_type_conflict _Var4;
  msg_type mVar5;
  msg_type mVar6;
  int32 peer_id_00;
  element_type *this_00;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> p;
  element_type *this_01;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  ulong uVar10;
  element_type *peVar11;
  pointer ppVar12;
  undefined8 uVar13;
  __shared_ptr *in_RDX;
  __shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  raft_server *in_RDI;
  resp_msg *in_stack_00000178;
  raft_server *in_stack_00000180;
  Param param;
  bool update_term_succ;
  int rpc_errs_1;
  peer *pp_1;
  iterator entry_1;
  int rpc_errs;
  iterator entry;
  ptr<peer> pp;
  int32 peer_id;
  unique_lock<std::recursive_mutex> guard;
  rpc_exception *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  Type in_stack_fffffffffffffc84;
  cb_func *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  int32_t my_id;
  resp_msg *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  raft_server *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd14;
  string local_228 [20];
  msg_type in_stack_fffffffffffffdec;
  string local_208 [32];
  string local_1e8 [32];
  resp_msg *in_stack_fffffffffffffe38;
  raft_server *in_stack_fffffffffffffe40;
  string local_1a8 [36];
  uint local_184;
  element_type *local_180;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_178;
  int32 local_16c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_168;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [36];
  undefined4 local_dc;
  string local_c8 [32];
  string local_a8 [8];
  resp_msg *in_stack_ffffffffffffff60;
  raft_server *in_stack_ffffffffffffff68;
  int local_74;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_70;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_68;
  __shared_ptr local_60 [8];
  resp_msg *in_stack_ffffffffffffffa8;
  raft_server *in_stack_ffffffffffffffb0;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             (mutex_type *)in_stack_fffffffffffffc78);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4b7466);
    rpc_exception::req(in_stack_fffffffffffffc78);
    this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4b7485);
    mVar6 = msg_base::get_dst(&this_00->super_msg_base);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x4b74a3);
    mVar5 = mVar6;
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)
               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    p._M_cur = (__node_type *)
               std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                       *)in_stack_fffffffffffffc78,(key_type *)0x4b74de);
    local_68._M_cur = p._M_cur;
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffc78);
    bVar1 = std::__detail::operator!=(&local_68,&local_70);
    if (bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator->
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x4b753c);
      std::shared_ptr<nuraft::peer>::operator=
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc78);
    }
    local_74 = 0;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_60);
    if (bVar1) {
      this_01 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4b75d8);
      peer::inc_rpc_errs(this_01);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4b75ef);
      local_74 = peer::get_rpc_errs((peer *)0x4b75f7);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc78);
      check_snapshot_timeout
                (in_stack_fffffffffffffd08,
                 (ptr<peer> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x4b764f);
    }
    _Var4 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffc88);
    if (local_74 < _Var4) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b76d7);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (2 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7710);
          peVar7 = std::
                   __shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4b7733);
          uVar13 = (**(code **)(*(long *)peVar7 + 0x10))();
          msg_if_given_abi_cxx11_
                    ((char *)local_a8,"peer (%d) response error: %s",(ulong)mVar6,uVar13);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x31e,local_a8);
          std::__cxx11::string::~string(local_a8);
        }
      }
    }
    else {
      _Var4 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)in_stack_fffffffffffffc88);
      if ((local_74 == _Var4) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_), bVar1)) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b782f);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (2 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7868);
          msg_if_given_abi_cxx11_
                    ((char *)local_c8,
                     "too verbose RPC error on peer (%d), will suppress it from now",(ulong)mVar6);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x321,local_c8);
          std::__cxx11::string::~string(local_c8);
        }
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_60);
    if (bVar1) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x4b791f);
      bVar1 = peer::is_leave_flag_set((peer *)0x4b7927);
      if (bVar1) {
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)
                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc78);
        handle_join_leave_rpc_err(in_RDI,mVar5,(ptr<peer> *)p._M_cur);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x4b7983);
      }
    }
    local_dc = 1;
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x4b79c0);
  }
  else {
    peVar8 = std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
    if (peVar8 == (element_type *)0x0) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7a1f);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (2 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7a58);
          msg_if_given_abi_cxx11_((char *)local_100,"empty peer response");
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x32d,local_100);
          std::__cxx11::string::~string(local_100);
        }
      }
      local_dc = 1;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7b22);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (4 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7b5b);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7b70);
          msg_base::get_type(&peVar11->super_msg_base);
          msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffdec);
          uVar13 = std::__cxx11::string::c_str();
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7bb9);
          uVar3 = msg_base::get_src(&peVar11->super_msg_base);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7bd7);
          bVar1 = resp_msg::get_accepted(peVar11);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7c09);
          uVar10 = msg_base::get_term(&peVar11->super_msg_base);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7c28);
          in_stack_fffffffffffffc78 = (rpc_exception *)resp_msg::get_next_idx(peVar11);
          msg_if_given_abi_cxx11_
                    ((char *)local_120,
                     "Receive a %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu",
                     uVar13,(ulong)uVar3,(ulong)bVar1,uVar10);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x337,local_120);
          std::__cxx11::string::~string(local_120);
          std::__cxx11::string::~string(local_140);
        }
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7d49);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (5 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b7d82);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7d97);
          uVar3 = msg_base::get_src(&peVar11->super_msg_base);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7db5);
          in_stack_fffffffffffffd14 = msg_base::get_dst(&peVar11->super_msg_base);
          peVar11 = std::
                    __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4b7dd3);
          in_stack_fffffffffffffd08 = (raft_server *)msg_base::get_term(&peVar11->super_msg_base);
          msg_if_given_abi_cxx11_
                    ((char *)local_160,"src: %d, dst: %d, resp->get_term(): %d\n",(ulong)uVar3,
                     (ulong)in_stack_fffffffffffffd14,(ulong)in_stack_fffffffffffffd08 & 0xffffffff)
          ;
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x33a,local_160);
          std::__cxx11::string::~string(local_160);
        }
      }
      peVar11 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b7e8c);
      bVar1 = resp_msg::get_accepted(peVar11);
      if (bVar1) {
        peVar11 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b7ed0);
        local_16c = msg_base::get_src(&peVar11->super_msg_base);
        local_168._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                     *)in_stack_fffffffffffffc78,(key_type *)0x4b7f04);
        local_178._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                    *)in_stack_fffffffffffffc78);
        bVar1 = std::__detail::operator!=(&local_168,&local_178);
        if (bVar1) {
          ppVar12 = std::__detail::
                    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                                  *)0x4b7f5f);
          local_180 = std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::get
                                (&(ppVar12->second).
                                  super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
          uVar3 = peer::get_rpc_errs((peer *)0x4b7f80);
          local_184 = uVar3;
          _Var4 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffc88);
          if ((_Var4 <= (int)uVar3) &&
             (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_), bVar1))
          {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4b7feb);
            iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
            if (2 < iVar2) {
              peVar9 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x4b801e);
              peVar11 = std::
                        __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x4b8030);
              uVar3 = msg_base::get_src(&peVar11->super_msg_base);
              msg_if_given_abi_cxx11_
                        ((char *)local_1a8,"recovered from RPC failure from peer %d, %d errors",
                         (ulong)uVar3,(ulong)local_184);
              (**(code **)(*(long *)peVar9 + 0x40))
                        (peVar9,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                         ,"handle_peer_resp",0x344,local_1a8);
              std::__cxx11::string::~string(local_1a8);
            }
          }
          peer::reset_rpc_errs((peer *)0x4b80d6);
          peer::reset_resp_timer((peer *)0x4b80e5);
        }
      }
      peVar11 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b80f8);
      mVar5 = msg_base::get_type(&peVar11->super_msg_base);
      bVar1 = is_valid_msg(mVar5);
      uVar14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcd0);
      if (bVar1) {
        peVar11 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b812c);
        in_stack_fffffffffffffcc8 = (resp_msg *)msg_base::get_term(&peVar11->super_msg_base);
        bVar1 = update_term((raft_server *)
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                            CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        if (bVar1) {
          local_dc = 1;
          goto LAB_004b8596;
        }
      }
      peVar11 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b8189);
      mVar6 = msg_base::get_type(&peVar11->super_msg_base);
      switch(mVar6) {
      case request_vote_response:
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_vote_resp(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        break;
      default:
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar1) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b8468);
          iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
          if (1 < iVar2) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4b849b);
            peVar11 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4b84ad);
            msg_base::get_type(&peVar11->super_msg_base);
            msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffdec);
            uVar13 = std::__cxx11::string::c_str();
            msg_if_given_abi_cxx11_
                      ((char *)local_208,"received an unexpected response: %s, ignore it",uVar13);
            (**(code **)(*(long *)peVar9 + 0x40))
                      (peVar9,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"handle_peer_resp",0x377,local_208);
            std::__cxx11::string::~string(local_208);
            std::__cxx11::string::~string(local_228);
          }
        }
        break;
      case append_entries_response:
        my_id = in_RDI->id_;
        _Var4 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffc88);
        peVar11 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4b8234);
        peer_id_00 = msg_base::get_src(&peVar11->super_msg_base);
        peVar8 = std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
        cb_func::Param::Param((Param *)&stack0xfffffffffffffe38,my_id,_Var4,peer_id_00,peVar8);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x4b8281);
        cb_func::call(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                      (Param *)in_stack_fffffffffffffc78);
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_append_entries_resp(in_stack_00000180,in_stack_00000178);
        break;
      case install_snapshot_response:
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_install_snapshot_resp(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        break;
      case ping_response:
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar1) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4b8339);
          iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
          if (3 < iVar2) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4b836c);
            peVar11 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4b837e);
            uVar3 = msg_base::get_src(&peVar11->super_msg_base);
            msg_if_given_abi_cxx11_((char *)local_1e8,"got ping response from %d",(ulong)uVar3);
            (**(code **)(*(long *)peVar9 + 0x40))
                      (peVar9,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"handle_peer_resp",0x36e,local_1e8);
            std::__cxx11::string::~string(local_1e8);
          }
        }
        break;
      case pre_vote_response:
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_prevote_resp(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        break;
      case priority_change_response:
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_priority_change_resp((raft_server *)CONCAT44(mVar5,uVar14),in_stack_fffffffffffffcc8)
        ;
        break;
      case custom_notification_response:
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
        handle_custom_notification_resp
                  ((raft_server *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (resp_msg *)in_stack_fffffffffffffd08);
      }
      local_dc = 0;
    }
  }
LAB_004b8596:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  return;
}

Assistant:

void raft_server::handle_peer_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        int32 peer_id = err->req()->get_dst();
        ptr<peer> pp = nullptr;
        auto entry = peers_.find(peer_id);
        if (entry != peers_.end()) pp = entry->second;

        int rpc_errs = 0;
        if (pp) {
            pp->inc_rpc_errs();
            rpc_errs = pp->get_rpc_errs();

            check_snapshot_timeout(pp);
        }

        if (rpc_errs < raft_server::raft_limits_.warning_limit_) {
            p_wn("peer (%d) response error: %s", peer_id, err->what());
        } else if (rpc_errs == raft_server::raft_limits_.warning_limit_) {
            p_wn("too verbose RPC error on peer (%d), "
                 "will suppress it from now", peer_id);
        }

        if (pp && pp->is_leave_flag_set()) {
            // If this is to-be-removed server, proceed it without
            // waiting for the response.
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, pp);
        }
        return;
    }

    if (!resp.get()) {
        p_wn("empty peer response");
        return;
    }

    p_db( "Receive a %s message from peer %d with "
          "Result=%d, Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    p_tr("src: %d, dst: %d, resp->get_term(): %d\n",
         (int)resp->get_src(), (int)resp->get_dst(), (int)resp->get_term());

    if (resp->get_accepted()) {
        // On accepted response, reset response timer.
        auto entry = peers_.find(resp->get_src());
        if (entry != peers_.end()) {
            peer* pp = entry->second.get();
            int rpc_errs = pp->get_rpc_errs();
            if (rpc_errs >= raft_server::raft_limits_.warning_limit_) {
                p_wn("recovered from RPC failure from peer %d, %d errors",
                     resp->get_src(), rpc_errs);
            }
            pp->reset_rpc_errs();
            pp->reset_resp_timer();
        }
    }

    if ( is_valid_msg(resp->get_type()) ) {
        bool update_term_succ = update_term(resp->get_term());

        // if term is updated, no more action is required
        if (update_term_succ) return;
    }

    // ignore the response that with lower term for safety
    switch (resp->get_type())
    {
    case msg_type::pre_vote_response:
        handle_prevote_resp(*resp);
        break;

    case msg_type::request_vote_response:
        handle_vote_resp(*resp);
        break;

    case msg_type::append_entries_response:
        {
            cb_func::Param param(id_, leader_, resp->get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesResp, &param);
        }
        handle_append_entries_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp(*resp);
        break;

    case msg_type::priority_change_response:
        handle_priority_change_resp(*resp);
        break;

    case msg_type::ping_response:
        p_in("got ping response from %d", resp->get_src());
        break;

    case msg_type::custom_notification_response:
        handle_custom_notification_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response: %s, ignore it",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}